

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::forEachNext
          (InvocationInterlockPlacementPass *this,uint32_t block_id,bool reverse_cfg,
          function<void_(unsigned_int)> *f)

{
  IRContext *this_00;
  _Manager_type p_Var1;
  pointer puVar2;
  _Invoker_type p_Var3;
  BasicBlock *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  undefined7 in_register_00000011;
  pointer puVar5;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = (this->super_Pass).context_;
  if ((int)CONCAT71(in_register_00000011,reverse_cfg) == 0) {
    if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(this_00);
    }
    pvVar4 = CFG::preds((this_00->cfg_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                        .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,block_id);
    puVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar5 != puVar2) {
      do {
        local_48._0_4_ = *puVar5;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*f->_M_invoker)((_Any_data *)f,(uint *)local_48._M_pod_data);
        puVar5 = puVar5 + 1;
      } while (puVar5 != puVar2);
    }
  }
  else {
    if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(this_00);
    }
    this_01 = CFG::block((this_00->cfg_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                         .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,block_id);
    local_58 = (_Manager_type)0x0;
    p_Stack_50 = (_Invoker_type)0x0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    p_Var1 = (f->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)(&local_68,(_Any_data *)f,__clone_functor);
      p_Stack_50 = f->_M_invoker;
      local_58 = (f->super__Function_base)._M_manager;
    }
    p_Var3 = p_Stack_50;
    p_Var1 = local_58;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x20);
    *(undefined8 *)local_48._M_unused._0_8_ = 0;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x10) = 0;
    *(_Invoker_type *)((long)local_48._M_unused._0_8_ + 0x18) = p_Var3;
    if (p_Var1 != (_Manager_type)0x0) {
      *(void **)local_48._M_unused._0_8_ = local_68._M_unused._M_object;
      *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = local_68._8_8_;
      *(_Manager_type *)((long)local_48._M_unused._0_8_ + 0x10) = p_Var1;
      local_58 = (_Manager_type)0x0;
      p_Stack_50 = (_Invoker_type)0x0;
    }
    local_30 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:70:34)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:70:34)>
               ::_M_manager;
    BasicBlock::ForEachSuccessorLabel(this_01,(function<void_(unsigned_int)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_58 != (_Manager_type)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
  }
  return;
}

Assistant:

void InvocationInterlockPlacementPass::forEachNext(
    uint32_t block_id, bool reverse_cfg, std::function<void(uint32_t)> f) {
  if (reverse_cfg) {
    BasicBlock* block = cfg()->block(block_id);

    block->ForEachSuccessorLabel([f](uint32_t succ_id) { f(succ_id); });
  } else {
    for (uint32_t pred_id : cfg()->preds(block_id)) {
      f(pred_id);
    }
  }
}